

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> __thiscall
cmm::BinaryOperatorAST::tryFoldBinOpRelation
          (BinaryOperatorAST *this,TokenKind TokenKind,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *LHS,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *RHS)

{
  _func_int **pp_Var1;
  AST AVar2;
  int iVar3;
  int iVar4;
  ExpressionAST *pEVar5;
  bool bVar6;
  ExpressionKind EVar7;
  _func_int **pp_Var8;
  byte bVar9;
  byte bVar10;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_78;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_70;
  string R;
  string L;
  
  local_70._M_head_impl =
       (LHS->_M_t).
       super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
       super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
       super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
  EVar7 = (local_70._M_head_impl)->Kind;
  if (EVar7 != StringExpression) {
    if (EVar7 == IntExpression) {
      pEVar5 = (RHS->_M_t).
               super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
               .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
      if ((pEVar5->Kind == IntExpression) && (TokenKind - Less < 6)) {
        iVar3 = *(int *)&(local_70._M_head_impl)->field_0xc;
        iVar4 = *(int *)&pEVar5->field_0xc;
        switch(TokenKind) {
        case Less:
          pp_Var8 = (_func_int **)operator_new(0x10);
          *(undefined4 *)(pp_Var8 + 1) = 2;
          *pp_Var8 = (_func_int *)&PTR__AST_0011f8e0;
          *(bool *)((long)pp_Var8 + 0xc) = iVar3 < iVar4;
          break;
        case LessEqual:
          pp_Var8 = (_func_int **)operator_new(0x10);
          *(undefined4 *)(pp_Var8 + 1) = 2;
          *pp_Var8 = (_func_int *)&PTR__AST_0011f8e0;
          *(bool *)((long)pp_Var8 + 0xc) = iVar3 <= iVar4;
          break;
        case EqualEqual:
          pp_Var8 = (_func_int **)operator_new(0x10);
          *(undefined4 *)(pp_Var8 + 1) = 2;
          *pp_Var8 = (_func_int *)&PTR__AST_0011f8e0;
          *(bool *)((long)pp_Var8 + 0xc) = iVar3 == iVar4;
          break;
        case ExclaimEqual:
          pp_Var8 = (_func_int **)operator_new(0x10);
          *(undefined4 *)(pp_Var8 + 1) = 2;
          *pp_Var8 = (_func_int *)&PTR__AST_0011f8e0;
          *(bool *)((long)pp_Var8 + 0xc) = iVar3 != iVar4;
          break;
        case Greater:
          pp_Var8 = (_func_int **)operator_new(0x10);
          *(undefined4 *)(pp_Var8 + 1) = 2;
          *pp_Var8 = (_func_int *)&PTR__AST_0011f8e0;
          *(bool *)((long)pp_Var8 + 0xc) = iVar4 < iVar3;
          break;
        case GreaterEqual:
          pp_Var8 = (_func_int **)operator_new(0x10);
          *(undefined4 *)(pp_Var8 + 1) = 2;
          *pp_Var8 = (_func_int *)&PTR__AST_0011f8e0;
          *(bool *)((long)pp_Var8 + 0xc) = iVar4 <= iVar3;
        }
        goto LAB_00110e87;
      }
      goto LAB_00110c06;
    }
LAB_00110baa:
    if (EVar7 != DoubleExpression) goto LAB_00110c06;
    pEVar5 = (RHS->_M_t).
             super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
             super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
    if ((pEVar5->Kind != DoubleExpression) || (5 < TokenKind - Less)) goto LAB_00110c49;
    pp_Var1 = local_70._M_head_impl[1].super_AST._vptr_AST;
    AVar2._vptr_AST = pEVar5[1].super_AST._vptr_AST;
    switch(TokenKind) {
    case Less:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar6 = (double)AVar2._vptr_AST < (double)pp_Var1;
      break;
    case LessEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar6 = (double)AVar2._vptr_AST < (double)pp_Var1;
      goto LAB_00110e72;
    case EqualEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar6 = (double)pp_Var1 == (double)AVar2._vptr_AST;
      goto LAB_00110e34;
    case ExclaimEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar6 = (double)pp_Var1 != (double)AVar2._vptr_AST;
LAB_00110e34:
      *(undefined4 *)(pp_Var8 + 1) = 2;
      *pp_Var8 = (_func_int *)&PTR__AST_0011f8e0;
      *(bool *)((long)pp_Var8 + 0xc) = bVar6;
      goto LAB_00110e87;
    case Greater:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar6 = (double)pp_Var1 < (double)AVar2._vptr_AST;
      break;
    case GreaterEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar6 = (double)pp_Var1 < (double)AVar2._vptr_AST;
LAB_00110e72:
      *(undefined4 *)(pp_Var8 + 1) = 2;
      *pp_Var8 = (_func_int *)&PTR__AST_0011f8e0;
      *(bool *)((long)pp_Var8 + 0xc) = !bVar6;
      goto LAB_00110e87;
    }
    *(undefined4 *)(pp_Var8 + 1) = 2;
    *pp_Var8 = (_func_int *)&PTR__AST_0011f8e0;
    *(bool *)((long)pp_Var8 + 0xc) = !bVar6 && (double)pp_Var1 != (double)AVar2._vptr_AST;
    goto LAB_00110e87;
  }
  if (((RHS->_M_t).
       super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
       super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
       super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl)->Kind == StringExpression) {
    std::__cxx11::string::string((string *)&L,(string *)(local_70._M_head_impl + 1));
    std::__cxx11::string::string
              ((string *)&R,
               (string *)
               ((RHS->_M_t).
                super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl + 1));
    switch(TokenKind) {
    case Less:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar6 = std::operator<(&L,&R);
      break;
    case LessEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar6 = std::operator<=(&L,&R);
      break;
    case EqualEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar6 = std::operator==(&L,&R);
      break;
    case ExclaimEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar6 = std::operator!=(&L,&R);
      break;
    case Greater:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar6 = std::operator>(&L,&R);
      break;
    case GreaterEqual:
      pp_Var8 = (_func_int **)operator_new(0x10);
      bVar6 = std::operator>=(&L,&R);
      break;
    default:
      std::__cxx11::string::~string((string *)&R);
      std::__cxx11::string::~string((string *)&L);
      local_70._M_head_impl =
           (LHS->_M_t).
           super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
           super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
           super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
      EVar7 = (local_70._M_head_impl)->Kind;
      goto LAB_00110baa;
    }
    *(undefined4 *)(pp_Var8 + 1) = 2;
    *pp_Var8 = (_func_int *)&PTR__AST_0011f8e0;
    *(bool *)((long)pp_Var8 + 0xc) = bVar6;
    (this->super_ExpressionAST).super_AST._vptr_AST = pp_Var8;
    std::__cxx11::string::~string((string *)&R);
    std::__cxx11::string::~string((string *)&L);
    return (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>)this;
  }
LAB_00110c06:
  if (((EVar7 != BoolExpression) ||
      (pEVar5 = (RHS->_M_t).
                super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl,
      pEVar5->Kind != BoolExpression)) || (5 < TokenKind - Less)) {
LAB_00110c49:
    (LHS->_M_t).super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
    _M_t.super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
    super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)0x0;
    local_78._M_head_impl =
         (RHS->_M_t).
         super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
         super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
         super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
    (RHS->_M_t).super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
    _M_t.super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
    super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)0x0;
    create(this,TokenKind,
           (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)&local_70,
           (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)&local_78);
    if (local_78._M_head_impl != (ExpressionAST *)0x0) {
      (*((local_78._M_head_impl)->super_AST)._vptr_AST[1])();
    }
    if (local_70._M_head_impl == (ExpressionAST *)0x0) {
      return (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>)this;
    }
    (*((local_70._M_head_impl)->super_AST)._vptr_AST[1])();
    return (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>)this;
  }
  bVar10 = (local_70._M_head_impl)->field_0xc;
  bVar9 = pEVar5->field_0xc;
  switch(TokenKind) {
  case Less:
    pp_Var8 = (_func_int **)operator_new(0x10);
    bVar9 = bVar9 & (bVar10 ^ 1);
    break;
  case LessEqual:
    pp_Var8 = (_func_int **)operator_new(0x10);
    bVar10 = bVar10 ^ 1;
    goto LAB_00110cf9;
  case EqualEqual:
    pp_Var8 = (_func_int **)operator_new(0x10);
    bVar10 = bVar10 ^ bVar9 ^ 1;
    goto LAB_00110cb8;
  case ExclaimEqual:
    pp_Var8 = (_func_int **)operator_new(0x10);
    bVar9 = bVar9 ^ bVar10;
    break;
  case Greater:
    pp_Var8 = (_func_int **)operator_new(0x10);
    bVar10 = bVar10 & ~bVar9;
LAB_00110cb8:
    *(undefined4 *)(pp_Var8 + 1) = 2;
    *pp_Var8 = (_func_int *)&PTR__AST_0011f8e0;
    *(byte *)((long)pp_Var8 + 0xc) = bVar10;
    goto LAB_00110e87;
  case GreaterEqual:
    pp_Var8 = (_func_int **)operator_new(0x10);
    bVar9 = bVar9 ^ 1;
LAB_00110cf9:
    bVar9 = bVar9 | bVar10;
  }
  *(undefined4 *)(pp_Var8 + 1) = 2;
  *pp_Var8 = (_func_int *)&PTR__AST_0011f8e0;
  *(byte *)((long)pp_Var8 + 0xc) = bVar9;
LAB_00110e87:
  (this->super_ExpressionAST).super_AST._vptr_AST = pp_Var8;
  return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>)
         (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<ExpressionAST>
BinaryOperatorAST::tryFoldBinOpRelation(Token::TokenKind TokenKind,
                                        std::unique_ptr<ExpressionAST> LHS,
                                        std::unique_ptr<ExpressionAST> RHS) {

#define CASE(TOKEN_KIND, OPERATOR)                                             \
  case Token::TOKEN_KIND:                                                      \
    return std::unique_ptr<BoolAST>(new BoolAST(L OPERATOR R))

#define TRY_COMPARE(type, Type)                                                \
  do {                                                                         \
    if (LHS->is##Type() && RHS->is##Type()) {                                  \
      type L = LHS->as_cptr<Type##AST>()->getValue();                          \
      type R = RHS->as_cptr<Type##AST>()->getValue();                          \
      switch (TokenKind) {                                                     \
      default: break;                                                          \
      CASE(Less, <);                                                           \
      CASE(LessEqual, <=);                                                     \
      CASE(EqualEqual, ==);                                                    \
      CASE(ExclaimEqual, !=);                                                  \
      CASE(GreaterEqual, >=);                                                  \
      CASE(Greater, >);                                                        \
      }                                                                        \
    }                                                                          \
  } while (0)

  TRY_COMPARE(int, Int);
  TRY_COMPARE(std::string, String);
  TRY_COMPARE(double, Double);
  TRY_COMPARE(bool, Bool);

#undef TRY_COMPARE
#undef CASE

  // TODO: Not very elegant, but this is ok.
  return BinaryOperatorAST::create(TokenKind, std::move(LHS), std::move(RHS));
}